

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# makefile.cpp
# Opt level: O2

bool __thiscall
MakefileGenerator::processPrlFile(MakefileGenerator *this,QString *file,bool baseOnly)

{
  char cVar1;
  undefined1 uVar2;
  int iVar3;
  qsizetype qVar4;
  qsizetype qVar5;
  undefined7 in_register_00000011;
  QArrayDataPointer<char16_t> *pQVar6;
  long in_FS_OFFSET;
  QStringView QVar7;
  QStringBuilder<QString_&,_QString_&> local_70;
  QStringView local_60;
  QArrayDataPointer<char16_t> local_48;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  local_48.size = -0x5555555555555556;
  local_48.d = (Data *)0xaaaaaaaaaaaaaaaa;
  local_48.ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
  fileFixify((QString *)&local_48,this,file,(FileFixifyTypes)0x3,true);
  if (((int)CONCAT71(in_register_00000011,baseOnly) == 0) &&
     (cVar1 = QString::endsWith((QString *)&local_48,0x26ba40), cVar1 != '\0')) {
    uVar2 = processPrlFileCore(this,file,(QStringView)ZEXT816(0),(QString *)&local_48);
  }
  else {
    local_70.b = &Option::prl_ext;
    local_70.a = (QString *)&local_48;
    QStringBuilder<QString_&,_QString_&>::convertTo<QString>((QString *)&local_60,&local_70);
    uVar2 = processPrlFileCore(this,file,(QStringView)ZEXT816(0),(QString *)&local_60);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_60);
    if (!baseOnly && !(bool)uVar2) {
      qVar4 = QString::lastIndexOf((QString *)&local_48,(QChar)0x2f,CaseSensitive);
      qVar5 = QString::lastIndexOf((QString *)&local_48,(QChar)0x5c,CaseSensitive);
      if (qVar5 < qVar4) {
        qVar5 = qVar4;
      }
      iVar3 = (int)qVar5 + 1;
      local_70.a = (QString *)local_48.size;
      local_70.b = (QString *)local_48.ptr;
      local_60 = QStringView::mid((QStringView *)&local_70,(long)iVar3,-1);
      qVar5 = QStringView::lastIndexOf(&local_60,(QChar)0x2e,CaseSensitive);
      if ((int)qVar5 == -1) {
        uVar2 = 0;
      }
      else {
        local_60.m_data = local_48.ptr;
        local_60.m_size = local_48.size;
        QVar7 = QStringView::mid(&local_60,(long)iVar3,-1);
        pQVar6 = (QArrayDataPointer<char16_t> *)(long)((int)qVar5 + iVar3);
        if ((ulong)local_48.size < pQVar6) {
          pQVar6 = (QArrayDataPointer<char16_t> *)local_48.size;
        }
        iVar3 = (*(this->super_QMakeSourceFileInfo)._vptr_QMakeSourceFileInfo[0x19])
                          (this,file,QVar7.m_size,QVar7.m_data,pQVar6,local_48.ptr,iVar3);
        uVar2 = (undefined1)iVar3;
      }
    }
  }
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_48);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_30) {
    __stack_chk_fail();
  }
  return (bool)uVar2;
}

Assistant:

bool
MakefileGenerator::processPrlFile(QString &file, bool baseOnly)
{
    QString f = fileFixify(file, FileFixifyBackwards);
    // Explicitly given full .prl name
    if (!baseOnly && f.endsWith(Option::prl_ext))
        return processPrlFileCore(file, QStringView(), f);
    // Explicitly given or derived (from -l) base name
    if (processPrlFileCore(file, QStringView(), f + Option::prl_ext))
        return true;
    if (!baseOnly) {
        // Explicitly given full library name
        int off = qMax(f.lastIndexOf('/'), f.lastIndexOf('\\')) + 1;
        int ext = QStringView(f).mid(off).lastIndexOf('.');
        if (ext != -1)
            return processPrlFileBase(file, QStringView(f).mid(off), QStringView{f}.left(off + ext), off);
    }
    return false;
}